

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extrinsic_geometry_interface.cpp
# Opt level: O3

void __thiscall
geometrycentral::surface::ExtrinsicGeometryInterface::computeFacePrincipalCurvatureDirections
          (ExtrinsicGeometryInterface *this)

{
  Vector2 *pVVar1;
  Vector2 VVar2;
  bool bVar3;
  SurfaceMesh *pSVar4;
  size_t sVar5;
  pointer puVar6;
  Vector2 *pVVar7;
  pointer puVar8;
  double *pdVar9;
  Vector2 *pVVar10;
  unsigned_long uVar11;
  unsigned_long uVar12;
  undefined1 auVar13 [16];
  long lVar14;
  size_t i_1;
  size_t sVar15;
  ulong uVar16;
  size_t i;
  unsigned_long uVar17;
  undefined1 auVar18 [16];
  double dVar19;
  double dVar20;
  double dVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  MeshData<geometrycentral::surface::Face,_geometrycentral::Vector2> local_70;
  
  if ((this->super_IntrinsicGeometryInterface).edgeLengthsQ.super_DependentQuantity.computed ==
      false) {
    if ((this->super_IntrinsicGeometryInterface).edgeLengthsQ.super_DependentQuantity.evaluateFunc.
        super__Function_base._M_manager == (_Manager_type)0x0) goto LAB_001af5ef;
    (*(this->super_IntrinsicGeometryInterface).edgeLengthsQ.super_DependentQuantity.evaluateFunc.
      _M_invoker)((_Any_data *)
                  &(this->super_IntrinsicGeometryInterface).edgeLengthsQ.super_DependentQuantity.
                   evaluateFunc);
    (this->super_IntrinsicGeometryInterface).edgeLengthsQ.super_DependentQuantity.computed = true;
  }
  if ((this->super_IntrinsicGeometryInterface).halfedgeVectorsInFaceQ.super_DependentQuantity.
      computed == false) {
    if ((this->super_IntrinsicGeometryInterface).halfedgeVectorsInFaceQ.super_DependentQuantity.
        evaluateFunc.super__Function_base._M_manager == (_Manager_type)0x0) goto LAB_001af5ef;
    (*(this->super_IntrinsicGeometryInterface).halfedgeVectorsInFaceQ.super_DependentQuantity.
      evaluateFunc._M_invoker)
              ((_Any_data *)
               &(this->super_IntrinsicGeometryInterface).halfedgeVectorsInFaceQ.
                super_DependentQuantity.evaluateFunc);
    (this->super_IntrinsicGeometryInterface).halfedgeVectorsInFaceQ.super_DependentQuantity.computed
         = true;
  }
  if ((this->edgeDihedralAnglesQ).super_DependentQuantity.computed == false) {
    if ((this->edgeDihedralAnglesQ).super_DependentQuantity.evaluateFunc.super__Function_base.
        _M_manager == (_Manager_type)0x0) {
LAB_001af5ef:
      ::std::__throw_bad_function_call();
    }
    (*(this->edgeDihedralAnglesQ).super_DependentQuantity.evaluateFunc._M_invoker)
              ((_Any_data *)&(this->edgeDihedralAnglesQ).super_DependentQuantity.evaluateFunc);
    (this->edgeDihedralAnglesQ).super_DependentQuantity.computed = true;
  }
  MeshData<geometrycentral::surface::Face,_geometrycentral::Vector2>::MeshData
            (&local_70,(this->super_IntrinsicGeometryInterface).super_BaseGeometryInterface.mesh);
  MeshData<geometrycentral::surface::Face,_geometrycentral::Vector2>::operator=
            (&this->facePrincipalCurvatureDirections,&local_70);
  MeshData<geometrycentral::surface::Face,_geometrycentral::Vector2>::~MeshData(&local_70);
  pSVar4 = (this->super_IntrinsicGeometryInterface).super_BaseGeometryInterface.mesh;
  sVar5 = pSVar4->nFacesFillCount;
  if ((sVar5 == 0) ||
     (puVar6 = (pSVar4->fHalfedgeArr).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start, *puVar6 != 0xffffffffffffffff)) {
    sVar15 = 0;
  }
  else {
    sVar15 = 0;
    do {
      if (sVar5 - 1 == sVar15) {
        return;
      }
      lVar14 = sVar15 + 1;
      sVar15 = sVar15 + 1;
    } while (puVar6[lVar14] == 0xffffffffffffffff);
  }
  if (sVar15 != sVar5) {
    pVVar7 = (this->facePrincipalCurvatureDirections).data.
             super_PlainObjectBase<Eigen::Matrix<geometrycentral::Vector2,__1,_1,_0,__1,_1>_>.
             m_storage.m_data;
    puVar6 = (pSVar4->heNextArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    puVar8 = (pSVar4->fHalfedgeArr).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    bVar3 = pSVar4->useImplicitTwinFlag;
    pdVar9 = (this->edgeDihedralAngles).data.
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
    pVVar10 = (this->super_IntrinsicGeometryInterface).halfedgeVectorsInFace.data.
              super_PlainObjectBase<Eigen::Matrix<geometrycentral::Vector2,__1,_1,_0,__1,_1>_>.
              m_storage.m_data;
    do {
      uVar11 = puVar8[sVar15];
      dVar19 = 0.0;
      dVar20 = 0.0;
      uVar17 = uVar11;
      do {
        if (bVar3 == false) {
          uVar16 = (pSVar4->heEdgeArr).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar17];
        }
        else {
          uVar16 = uVar17 >> 1;
        }
        dVar21 = 1.0 / (this->super_IntrinsicGeometryInterface).edgeLengths.data.
                       super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                       m_data[uVar16];
        uVar12 = puVar6[uVar17];
        VVar2 = pVVar10[uVar17];
        auVar23._0_8_ = -pVVar10[uVar17].y;
        auVar23._8_8_ = 0x8000000000000000;
        auVar18 = vshufpd_avx((undefined1  [16])VVar2,(undefined1  [16])VVar2,1);
        auVar13 = vshufpd_avx((undefined1  [16])VVar2,auVar23,1);
        auVar24._0_8_ = auVar18._0_8_ * auVar13._0_8_;
        auVar24._8_8_ = auVar18._8_8_ * auVar13._8_8_;
        auVar18._8_8_ = pVVar10[uVar17].x;
        auVar18._0_8_ = pVVar10[uVar17].x;
        auVar18 = vfnmadd231pd_avx512vl(auVar24,(undefined1  [16])VVar2,auVar18);
        auVar22._0_8_ = dVar21 * auVar18._0_8_;
        auVar22._8_8_ = dVar21 * auVar18._8_8_;
        dVar21 = pdVar9[uVar16];
        auVar13._8_8_ = dVar21;
        auVar13._0_8_ = dVar21;
        auVar18 = vmulpd_avx512vl(auVar22,auVar13);
        dVar19 = dVar19 + auVar18._0_8_;
        dVar20 = dVar20 + auVar18._8_8_;
        uVar17 = uVar12;
      } while (uVar12 != uVar11);
      pVVar1 = pVVar7 + sVar15;
      pVVar1->x = dVar19 * 0.25;
      pVVar1->y = dVar20 * 0.25;
      do {
        if (sVar5 - 1 == sVar15) {
          return;
        }
        lVar14 = sVar15 + 1;
        sVar15 = sVar15 + 1;
      } while (puVar8[lVar14] == 0xffffffffffffffff);
    } while (sVar5 != sVar15);
  }
  return;
}

Assistant:

void ExtrinsicGeometryInterface::computeFacePrincipalCurvatureDirections() {
  edgeLengthsQ.ensureHave();
  halfedgeVectorsInFaceQ.ensureHave();
  edgeDihedralAnglesQ.ensureHave();

  facePrincipalCurvatureDirections = FaceData<Vector2>(mesh);

  for (Face f : mesh.faces()) {
    Vector2 principalDir{0.0, 0.0};
    for (Halfedge he : f.adjacentHalfedges()) {
      double len = edgeLengths[he.edge()];
      double alpha = edgeDihedralAngles[he.edge()];
      Vector2 vec = halfedgeVectorsInFace[he];
      principalDir += -vec * vec / len * alpha;
    }

    facePrincipalCurvatureDirections[f] = principalDir / 4;
  }
}